

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_sve2_pmull_h_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  byte bVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  bVar1 = (byte)((int)desc >> 7);
  for (uVar3 = 0; (desc & 0x1f) * 8 + 8 >> 3 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = pmull_h(*(ulong *)((long)vn + uVar3 * 8) >> (bVar1 & 0x38) & 0xff00ff00ff00ff,
                    *(ulong *)((long)vm + uVar3 * 8) >> (bVar1 & 0x38) & 0xff00ff00ff00ff);
    *(uint64_t *)((long)vd + uVar3 * 8) = uVar2;
  }
  return;
}

Assistant:

void HELPER(sve2_pmull_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    int shift = simd_data(desc) * 8;
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        uint64_t nn = (n[i] >> shift) & 0x00ff00ff00ff00ffull;
        uint64_t mm = (m[i] >> shift) & 0x00ff00ff00ff00ffull;

        d[i] = pmull_h(nn, mm);
    }
}